

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O1

void __thiscall QPageSetupDialog::QPageSetupDialog(QPageSetupDialog *this,QWidget *parent)

{
  QUnixPageSetupDialogPrivate *this_00;
  QPageSetupDialogPrivate *this_01;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QArrayData *local_38 [3];
  long local_20;
  
  ctx = (EVP_PKEY_CTX *)local_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QPageSetupDialogPrivate *)operator_new(800);
  QPageSetupDialogPrivate::QPageSetupDialogPrivate(this_01,(QPrinter *)0x0);
  *(undefined ***)this_01 = &PTR__QUnixPageSetupDialogPrivate_00166bb8;
  QDialog::QDialog((QDialog *)this,this_01,parent,0);
  *(undefined ***)this = &PTR_metaObject_00166e98;
  *(undefined ***)(this + 0x10) = &PTR__QPageSetupDialog_00167070;
  this_00 = *(QUnixPageSetupDialogPrivate **)(this + 8);
  QCoreApplication::translate((char *)local_38,"QPrintPreviewDialog","Page Setup",0);
  QWidget::setWindowTitle((QString *)this);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      ctx = (EVP_PKEY_CTX *)0x2;
      QArrayData::deallocate(local_38[0],2,0x10);
    }
  }
  QUnixPageSetupDialogPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPageSetupDialog::QPageSetupDialog(QWidget *parent)
    : QDialog(*(new QUnixPageSetupDialogPrivate(nullptr)), parent)
{
    Q_D(QPageSetupDialog);
    setWindowTitle(QCoreApplication::translate("QPrintPreviewDialog", "Page Setup"));
    static_cast<QUnixPageSetupDialogPrivate *>(d)->init();
}